

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::FeatureType::ByteSizeLong(FeatureType *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = (ulong)this->isoptional_ * 3;
  switch(this->_oneof_case_[0]) {
  case 1:
  case 2:
  case 3:
    ((this->Type_).int64type_)->_cached_size_ = 0;
    sVar2 = sVar2 + 2;
    goto switchD_00195e75_default;
  case 4:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ImageFeatureType>((this->Type_).imagetype_);
    break;
  case 5:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ArrayFeatureType>
                      ((this->Type_).multiarraytype_);
    break;
  case 6:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DictionaryFeatureType>
                      ((this->Type_).dictionarytype_);
    break;
  case 7:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SequenceFeatureType>
                      ((this->Type_).sequencetype_);
    break;
  default:
    goto switchD_00195e75_default;
  }
  sVar2 = sVar2 + sVar1 + 1;
switchD_00195e75_default:
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t FeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FeatureType)
  size_t total_size = 0;

  // bool isOptional = 1000;
  if (this->isoptional() != 0) {
    total_size += 2 + 1;
  }

  switch (Type_case()) {
    // .CoreML.Specification.Int64FeatureType int64Type = 1;
    case kInt64Type: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.int64type_);
      break;
    }
    // .CoreML.Specification.DoubleFeatureType doubleType = 2;
    case kDoubleType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.doubletype_);
      break;
    }
    // .CoreML.Specification.StringFeatureType stringType = 3;
    case kStringType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.stringtype_);
      break;
    }
    // .CoreML.Specification.ImageFeatureType imageType = 4;
    case kImageType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.imagetype_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureType multiArrayType = 5;
    case kMultiArrayType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.multiarraytype_);
      break;
    }
    // .CoreML.Specification.DictionaryFeatureType dictionaryType = 6;
    case kDictionaryType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.dictionarytype_);
      break;
    }
    // .CoreML.Specification.SequenceFeatureType sequenceType = 7;
    case kSequenceType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.sequencetype_);
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}